

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12dGPUCachePolicyULT.cpp
# Opt level: O0

void __thiscall
CTestGen12dGPUCachePolicy::CheckMocsIdxHDCL1
          (CTestGen12dGPUCachePolicy *this,uint32_t Usage,uint32_t AssignedMocsIdx,
          GMM_CACHE_POLICY_ELEMENT ClientRequest)

{
  bool bVar1;
  Message *pMVar2;
  char *pcVar3;
  AssertHelper local_b0;
  Message local_a8;
  int local_9c;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_2;
  int local_7c;
  Message local_78;
  int local_6c;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_1;
  int local_4c;
  Message local_48 [3];
  int local_2c;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  uint32_t AssignedMocsIdx_local;
  uint32_t Usage_local;
  CTestGen12dGPUCachePolicy *this_local;
  
  gtest_ar.message_.ptr_._0_4_ = AssignedMocsIdx;
  gtest_ar.message_.ptr_._4_4_ = Usage;
  if ((ClientRequest.field_1.Value >> 0x12 & 1) == 0) {
    if (AssignedMocsIdx < 0x3c) {
      local_9c = 0x30;
      testing::internal::CmpHelperLT<unsigned_int,int>
                ((internal *)local_98,"AssignedMocsIdx","(48)",(uint *)&gtest_ar.message_,&local_9c)
      ;
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
      if (!bVar1) {
        testing::Message::Message(&local_a8);
        pMVar2 = testing::Message::operator<<(&local_a8,(char (*) [8])"Usage# ");
        pMVar2 = testing::Message::operator<<(pMVar2,(uint *)((long)&gtest_ar.message_.ptr_ + 4));
        pMVar2 = testing::Message::operator<<
                           (pMVar2,(char (*) [36])": Incorrect Index for HDCL1 setting");
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
        testing::internal::AssertHelper::AssertHelper
                  (&local_b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12dGPUCachePolicyULT.cpp"
                   ,0x81,pcVar3);
        testing::internal::AssertHelper::operator=(&local_b0,pMVar2);
        testing::internal::AssertHelper::~AssertHelper(&local_b0);
        testing::Message::~Message(&local_a8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
    }
  }
  else {
    local_2c = 0x30;
    testing::internal::CmpHelperGE<unsigned_int,int>
              ((internal *)local_28,"AssignedMocsIdx","(48)",(uint *)&gtest_ar.message_,&local_2c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
    if (!bVar1) {
      testing::Message::Message(local_48);
      pMVar2 = testing::Message::operator<<(local_48,(char (*) [8])"Usage# ");
      pMVar2 = testing::Message::operator<<(pMVar2,(uint *)((long)&gtest_ar.message_.ptr_ + 4));
      pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [30])": Index must be greater than ");
      local_4c = 0x2f;
      pMVar2 = testing::Message::operator<<(pMVar2,&local_4c);
      pMVar2 = testing::Message::operator<<
                         (pMVar2,(char (*) [35])" for HDCL1 setting. AssignedMocs: ");
      pMVar2 = testing::Message::operator<<(pMVar2,(uint *)&gtest_ar.message_);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12dGPUCachePolicyULT.cpp"
                 ,0x7c,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,pMVar2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(local_48);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
    local_6c = 0x3c;
    testing::internal::CmpHelperLT<unsigned_int,int>
              ((internal *)local_68,"AssignedMocsIdx","(60)",(uint *)&gtest_ar.message_,&local_6c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
    if (!bVar1) {
      testing::Message::Message(&local_78);
      pMVar2 = testing::Message::operator<<(&local_78,(char (*) [8])"Usage# ");
      pMVar2 = testing::Message::operator<<(pMVar2,(uint *)((long)&gtest_ar.message_.ptr_ + 4));
      pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [27])": Index must be less than ");
      local_7c = 0x3c;
      pMVar2 = testing::Message::operator<<(pMVar2,&local_7c);
      pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [19])"for  HDCL1 setting");
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12dGPUCachePolicyULT.cpp"
                 ,0x7d,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,pMVar2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_78);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  }
  return;
}

Assistant:

void CTestGen12dGPUCachePolicy::CheckMocsIdxHDCL1(uint32_t                    Usage,
                                                uint32_t                    AssignedMocsIdx,
                                                GMM_CACHE_POLICY_ELEMENT ClientRequest)
{
#define GMM_GEN12_MAX_NUMBER_MOCS_INDEXES (60) // On TGL last four (#60-#63) are reserved by h/w, few? are sw configurable though (#60)

    // Check of assigned Index setting is appropriate for HDCL1 setting
    if(ClientRequest.HDCL1)
    {
        EXPECT_GE(AssignedMocsIdx, GMM_GEN10_HDCL1_MOCS_INDEX_START) << "Usage# " << Usage << ": Index must be greater than " << GMM_GEN10_HDCL1_MOCS_INDEX_START - 1 << " for HDCL1 setting. AssignedMocs: " << AssignedMocsIdx;
        EXPECT_LT(AssignedMocsIdx, GMM_GEN12_MAX_NUMBER_MOCS_INDEXES) << "Usage# " << Usage << ": Index must be less than " << GMM_GEN12_MAX_NUMBER_MOCS_INDEXES << "for  HDCL1 setting";
    }
    else if(AssignedMocsIdx < GMM_GEN12_MAX_NUMBER_MOCS_INDEXES)
    {
        EXPECT_LT(AssignedMocsIdx, GMM_GEN10_HDCL1_MOCS_INDEX_START) << "Usage# " << Usage << ": Incorrect Index for HDCL1 setting";
    }
}